

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QRect __thiscall QDockAreaLayout::gapRect(QDockAreaLayout *this,DockPosition dockPos)

{
  uint uVar1;
  int iVar2;
  QWidgetData *pQVar3;
  Representation RVar4;
  uint uVar5;
  QSize QVar6;
  QMainWindow *pQVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  Representation RVar11;
  long in_FS_OFFSET;
  QRect QVar12;
  QSize local_48;
  undefined4 uStack_40;
  undefined8 uStack_3c;
  undefined4 local_34;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QVar6 = QWidget::size(&this->mainWindow->super_QWidget);
  local_48.wd = QVar6.wd.m_i;
  local_48.ht = QVar6.ht.m_i;
  QVar6 = operator/(&local_48,2.0);
  RVar11.m_i = 0x50;
  if (QVar6.wd.m_i.m_i < 0x50) {
    RVar11.m_i = QVar6.wd.m_i.m_i;
  }
  RVar4.m_i = 0x50;
  if (QVar6.ht.m_i.m_i < 0x50) {
    RVar4.m_i = QVar6.ht.m_i.m_i;
  }
  pQVar7 = this->mainWindow;
  pQVar3 = (pQVar7->super_QWidget).data;
  if (((pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i) + 1 < this->sep * 2) {
    QtPrivateLogging::lcQpaDockWidgets();
    pQVar7 = this->mainWindow;
    if (((byte)QtPrivateLogging::lcQpaDockWidgets::category.field_2.bools.enabledWarning._q_value.
               _M_base._M_i & 1) != 0) {
      local_48.wd.m_i = 2;
      local_34 = 0;
      local_48.ht.m_i = 0;
      uStack_40 = 0;
      uStack_3c = 0;
      local_30 = QtPrivateLogging::lcQpaDockWidgets::category.name;
      pQVar3 = (pQVar7->super_QWidget).data;
      QMessageLogger::warning
                ((char *)&local_48,
                 "QDockAreaLayout::gapRect: Main window height %i is too small. Docking will not be possible."
                 ,(ulong)(((pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i) + 1));
      pQVar7 = this->mainWindow;
    }
  }
  pQVar3 = (pQVar7->super_QWidget).data;
  if ((((pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i) + 1 < this->sep * 2) &&
     (QtPrivateLogging::lcQpaDockWidgets(),
     ((byte)QtPrivateLogging::lcQpaDockWidgets::category.field_2.bools.enabledWarning._q_value.
            _M_base._M_i & 1) != 0)) {
    local_48.wd.m_i = 2;
    local_34 = 0;
    local_48.ht.m_i = 0;
    uStack_40 = 0;
    uStack_3c = 0;
    local_30 = QtPrivateLogging::lcQpaDockWidgets::category.name;
    pQVar3 = (this->mainWindow->super_QWidget).data;
    QMessageLogger::warning
              ((char *)&local_48,
               "QDockAreaLayout::gapRect: Main window width %i is too small. Docking will not be possible."
               ,(ulong)(((pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i) + 1));
  }
  switch(dockPos) {
  case LeftDock:
    uVar5 = (this->rect).x1.m_i;
    uVar9 = (ulong)(uint)(this->rect).y1.m_i;
    uVar10 = (ulong)(uint)(this->rect).y2.m_i;
    uVar8 = (ulong)((RVar11.m_i + uVar5) - 1);
    break;
  case RightDock:
    uVar9 = (ulong)(uint)(this->rect).y1.m_i;
    iVar2 = (this->rect).x2.m_i;
    uVar5 = iVar2 - RVar11.m_i;
    uVar10 = (ulong)(uint)(this->rect).y2.m_i;
    uVar8 = (ulong)(iVar2 - 1);
    break;
  case TopDock:
    uVar5 = (this->rect).x1.m_i;
    uVar1 = (this->rect).y1.m_i;
    uVar9 = (ulong)uVar1;
    uVar8 = (ulong)(uint)(this->rect).x2.m_i;
    uVar10 = (ulong)((RVar4.m_i + uVar1) - 1);
    break;
  case BottomDock:
    uVar5 = (this->rect).x1.m_i;
    uVar8 = (ulong)(uint)(this->rect).x2.m_i;
    iVar2 = (this->rect).y2.m_i;
    uVar9 = (ulong)(uint)(iVar2 - RVar4.m_i);
    uVar10 = (ulong)(iVar2 - 1);
    break;
  default:
    uVar8 = 0xffffffffffffffff;
    uVar5 = 0;
    uVar9 = 0;
    uVar10 = 0xffffffff;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  QVar12._0_8_ = (ulong)uVar5 | uVar9 << 0x20;
  QVar12._8_8_ = uVar8 & 0xffffffff | uVar10 << 0x20;
  return QVar12;
}

Assistant:

QRect QDockAreaLayout::gapRect(QInternal::DockPosition dockPos) const
{
    Q_ASSERT_X(mainWindow, "QDockAreaLayout::gapRect", "Called without valid mainWindow pointer.");

    // Determine gap size depending on MainWindow size (QTBUG-101657)
    const QSize gapSize = (mainWindow->size()/2).boundedTo(QSize(EmptyDropAreaSize, EmptyDropAreaSize));

    // Warn if main window is too small to create proper docks.
    // Do not fail because this can be triggered by a user making MainWindow too small
    if (mainWindow->height() < (2 * sep)) {
        qCWarning(lcQpaDockWidgets,
            "QDockAreaLayout::gapRect: Main window height %i is too small. Docking will not be possible.",
            mainWindow->height());

    }
    if (mainWindow->width() < (2 * sep)) {
        qCWarning(lcQpaDockWidgets,
            "QDockAreaLayout::gapRect: Main window width %i is too small. Docking will not be possible.",
            mainWindow->width());
    }

    // Calculate rectangle of requested dock
    switch (dockPos) {
    case QInternal::LeftDock:
        return QRect(rect.left(), rect.top(), gapSize.width(), rect.height());
    case QInternal::RightDock:
        return QRect(rect.right() - gapSize.width(), rect.top(), gapSize.width(), rect.height());
    case QInternal::TopDock:
        return QRect(rect.left(), rect.top(), rect.width(), gapSize.height());
    case QInternal::BottomDock:
        return QRect(rect.left(), rect.bottom() - gapSize.height(), rect.width(), gapSize.height());
    case QInternal::DockCount:
        break;
    }
    return QRect();
}